

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O0

void __thiscall
rlottie::Animation::setValue(undefined8 param_1,undefined4 param_2,AnimationImpl *param_3)

{
  pointer keypath;
  anon_class_8_1_a8c68091 *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  
  keypath = std::unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_>::operator->
                      ((unique_ptr<AnimationImpl,_std::default_delete<AnimationImpl>_> *)0x1a398e);
  std::function<rlottie::Size(rlottie::FrameInfo_const&)>::
  function<rlottie::Animation::setValue(rlottie::Size_Type,rlottie::Property,std::__cxx11::string_const&,rlottie::Size)::__0,void>
            ((function<rlottie::Size_(const_rlottie::FrameInfo_&)> *)
             CONCAT44(param_2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
  LOTVariant::LOTVariant
            ((LOTVariant *)param_3,(Property)((ulong)keypath >> 0x20),
             (SizeFunc *)CONCAT44(param_2,in_stack_ffffffffffffff70));
  AnimationImpl::setValue
            (param_3,(string *)keypath,(LOTVariant *)CONCAT44(param_2,in_stack_ffffffffffffff70));
  LOTVariant::~LOTVariant((LOTVariant *)CONCAT44(param_2,in_stack_ffffffffffffff70));
  std::function<rlottie::Size_(const_rlottie::FrameInfo_&)>::~function
            ((function<rlottie::Size_(const_rlottie::FrameInfo_&)> *)0x1a39fc);
  return;
}

Assistant:

void Animation::setValue(Size_Type, Property prop, const std::string &keypath,
                         Size value)
{
    d->setValue(keypath,
                LOTVariant(prop, [value](const FrameInfo &) { return value; }));
}